

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_callm(m68k_info *info)

{
  m68k_info *in_RDI;
  int unaff_retaddr;
  uint8_t in_stack_0000000b;
  int in_stack_0000000c;
  
  if ((in_RDI->type & 4) == 0) {
    d68000_invalid((m68k_info *)0x3a1e33);
  }
  else {
    read_imm_8(in_RDI);
    build_imm_ea(info,in_stack_0000000c,in_stack_0000000b,unaff_retaddr);
  }
  return;
}

Assistant:

static void d68020_callm(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_ONLY);
	build_imm_ea(info, M68K_INS_CALLM, 0, read_imm_8(info));
}